

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O1

int cfg_schema_validate(cfg_db *db,_Bool cleanup,_Bool ignore_unknown,autobuf *out)

{
  list_entity *array;
  list_entity *plVar1;
  bool bVar2;
  int iVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  char *pcVar6;
  avl_node *paVar7;
  size_t sVar8;
  list_entity *plVar9;
  list_entity *plVar10;
  byte bVar11;
  avl_node *paVar12;
  list_entity *plVar13;
  list_entity *__s;
  list_entity *plVar14;
  byte bVar15;
  list_entity *plVar16;
  bool bVar17;
  char section_name [256];
  list_entity *local_148;
  list_entity *local_140;
  char local_138 [264];
  
  if (db->schema == (cfg_schema *)0x0) {
    iVar3 = -1;
  }
  else {
    plVar9 = (db->sectiontypes).list_head.next;
    if (plVar9->prev == (db->sectiontypes).list_head.prev) {
      bVar11 = 0;
    }
    else {
      bVar11 = 0;
      do {
        plVar14 = plVar9->next;
        paVar4 = avl_find(&db->schema->sections,plVar9[3].prev);
        if (paVar4 == (avl_node *)0x0) {
          if (!ignore_unknown) {
            cfg_append_printable_line
                      (out,"Cannot find schema for section type \'%s\'",plVar9[3].prev);
            bVar11 = 1;
            if (cleanup) goto LAB_00149edf;
          }
        }
        else {
          paVar5 = avl_find_lessequal(&db->schema->sections,plVar9[3].prev);
          paVar7 = (avl_node *)(paVar4->list).prev;
          while (paVar7 != paVar5) {
            plVar16 = plVar9[4].prev;
            if (plVar16->prev != plVar9[5].next) {
              do {
                plVar1 = plVar16->next;
                plVar10 = plVar16[3].prev;
                if ((plVar10 == (list_entity *)0x0) || (*(int *)&paVar4[1].parent != 0)) {
                  bVar15 = 0;
                }
                else {
                  cfg_append_printable_line
                            (out,
                             "The section type \'%s\' has to be used without a name (\'%s\' was given as a name)"
                             ,plVar9[3].prev,plVar10);
                  bVar15 = 1;
                }
                if (plVar10 != (list_entity *)0x0) {
                  plVar13 = plVar16[3].prev;
                  pcVar6 = strchr((char *)plVar13,0x20);
                  if (pcVar6 != (char *)0x0) {
                    cfg_append_printable_line
                              (out,
                               "The section name \'%s\' for type \'%s\' contains illegal characters"
                               ,plVar13,plVar9[3].prev);
                    bVar15 = 1;
                  }
                }
                if ((bVar15 & cleanup) == 1) {
                  cfg_db_remove_namedsection(db,(char *)plVar9[3].prev,(char *)plVar16[3].prev);
                }
                bVar11 = bVar11 | bVar15;
                if (bVar15 == 0) {
                  pcVar6 = "=";
                  plVar13 = (list_entity *)0x1610d0;
                  if (plVar10 == (list_entity *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    plVar13 = plVar16[3].prev;
                  }
                  snprintf(local_138,0x100,"\'%s%s%s\'",plVar9[3].prev,pcVar6,plVar13);
                  plVar10 = plVar16[4].prev;
                  if (plVar10->prev != plVar16[5].next) {
                    do {
                      plVar13 = plVar10->next;
                      local_148 = plVar9[3].prev;
                      local_140 = plVar10[3].prev;
                      paVar7 = avl_find(&db->schema->entries,&local_148);
                      if ((paVar7 == (avl_node *)0x0) ||
                         (paVar7 == (avl_node *)&db->schema->entries)) {
                        bVar15 = 0;
                        bVar17 = false;
                      }
                      else {
                        array = plVar10 + 4;
                        bVar15 = 0;
                        paVar12 = paVar7;
                        bVar2 = false;
                        do {
                          bVar17 = bVar2;
                          if ((paVar12 != paVar7) && (paVar12->follower != true)) break;
                          if (paVar12[2].list.next != (list_entity *)0x0) {
                            __s = array->next;
                            if (__s != (list_entity *)0x0) {
                              if ((long)plVar10[4].prev < 1) {
                                bVar17 = false;
                              }
                              else {
                                bVar2 = false;
                                do {
                                  if ((!bVar2) &&
                                     (iVar3 = (*(code *)paVar12[2].list.next)
                                                        (paVar12,local_138,__s,out), iVar3 != 0)) {
                                    bVar15 = 1;
                                  }
                                  if (((bVar15 | bVar2) & cleanup) == 1) {
                                    strarray_remove_ext((strarray *)array,(char *)__s,false);
                                  }
                                  else {
                                    sVar8 = strlen((char *)__s);
                                    __s = (list_entity *)((long)&__s->next + sVar8 + 1);
                                  }
                                  bVar17 = array->next == (list_entity *)0x0;
                                  if (bVar17) goto LAB_00149dba;
                                  if (paVar12[1].balance == '\0') {
                                    bVar2 = true;
                                  }
                                } while (__s < (list_entity *)
                                               ((long)&(plVar10[4].prev)->next +
                                               (long)&array->next->next));
                              }
                              if (!bVar17) goto LAB_00149dd3;
                            }
LAB_00149dba:
                            cfg_db_remove_entry(db,(char *)plVar9[3].prev,(char *)plVar16[3].prev,
                                                (char *)plVar10[3].prev);
                          }
LAB_00149dd3:
                          paVar12 = (avl_node *)(paVar12->list).next;
                          if (paVar12 == (avl_node *)0x0) {
                            bVar17 = true;
                            break;
                          }
                          bVar17 = true;
                          bVar2 = true;
                        } while (paVar12 != (avl_node *)&db->schema->entries);
                      }
                      if (!bVar17 && !ignore_unknown) {
                        cfg_append_printable_line
                                  (out,"Entry \'%s\' in section %s is unknown",plVar10[3].prev,
                                   local_138);
                        bVar15 = 1;
                      }
                      bVar11 = bVar11 | bVar15;
                      plVar10 = plVar13;
                    } while (plVar13->prev != plVar16[5].next);
                  }
                  if (((bVar11 == 0) && (paVar4[1].right != (avl_node *)0x0)) &&
                     (iVar3 = (*(code *)paVar4[1].right)(local_138,plVar16,out), iVar3 != 0)) {
                    bVar11 = 1;
                  }
                }
                plVar16 = plVar1;
              } while (plVar1->prev != plVar9[5].next);
            }
            paVar4 = (avl_node *)(paVar4->list).next;
            paVar7 = (avl_node *)(paVar4->list).prev;
          }
          if ((cleanup) && (*(int *)&plVar9[6].next == 0)) {
LAB_00149edf:
            cfg_db_remove_sectiontype(db,(char *)plVar9[3].prev);
          }
        }
        plVar9 = plVar14;
      } while (plVar14->prev != (db->sectiontypes).list_head.prev);
    }
    plVar9 = (db->schema->sections).list_head.next;
    if (plVar9->prev != (db->schema->sections).list_head.prev) {
      do {
        paVar4 = avl_find(&db->sectiontypes,plVar9[3].prev);
        if (*(int *)&plVar9[4].prev == 2) {
          bVar17 = true;
          if ((paVar4 != (avl_node *)0x0) && (*(int *)&paVar4[1].key != 0)) {
            if (paVar4[1].parent[1].list.next == (list_entity *)0x0) {
              bVar17 = *(uint *)&paVar4[1].key < 2;
            }
            else {
              bVar17 = false;
            }
          }
          if (bVar17 != false) {
            cfg_append_printable_line(out,"Missing mandatory section of type \'%s\'",plVar9[3].prev)
            ;
          }
          bVar11 = bVar11 | bVar17;
        }
        if (plVar9[9].prev != (list_entity *)0x0) {
          plVar14 = (list_entity *)0x0;
          do {
            if ((paVar4 != (avl_node *)0x0) &&
               (plVar16 = plVar9[9].next, *(long *)((long)plVar16 + (long)plVar14 * 200 + 0x50) == 0
               )) {
              paVar7 = avl_find((avl_tree *)&paVar4[1].parent,(void *)0x0);
              if (paVar7 == (avl_node *)0x0) {
                bVar17 = true;
              }
              else {
                paVar7 = avl_find((avl_tree *)&paVar7[1].parent,
                                  *(void **)((long)plVar16 + (long)plVar14 * 200 + 0x48));
                bVar17 = paVar7 == (avl_node *)0x0;
              }
              if (bVar17 != false) {
                for (paVar7 = paVar4[1].parent; (avl_node *)(paVar7->list).prev != paVar4[1].left;
                    paVar7 = (avl_node *)(paVar7->list).next) {
                  if ((paVar7[1].list.next != (list_entity *)0x0) &&
                     (paVar5 = avl_find((avl_tree *)&paVar7[1].parent,
                                        *(void **)((long)plVar16 + (long)plVar14 * 200 + 0x48)),
                     paVar5 == (avl_node *)0x0)) {
                    cfg_append_printable_line
                              (out,
                               "Missing mandatory entry of type \'%s\', name \'%s\' and key \'%s\'",
                               plVar9[3].prev,paVar7[1].list.next,
                               *(undefined8 *)((long)plVar16 + (long)plVar14 * 200 + 0x48));
                    bVar17 = true;
                    goto LAB_0014a046;
                  }
                }
                bVar17 = false;
              }
LAB_0014a046:
              bVar11 = bVar11 | bVar17;
            }
            plVar14 = (list_entity *)((long)&plVar14->next + 1);
          } while (plVar14 < plVar9[9].prev);
        }
        plVar9 = plVar9->next;
      } while (plVar9->prev != (db->schema->sections).list_head.prev);
    }
    iVar3 = -(uint)bVar11;
  }
  return iVar3;
}

Assistant:

int
cfg_schema_validate(struct cfg_db *db, bool cleanup, bool ignore_unknown, struct autobuf *out) {
  char section_name[256];
  struct cfg_section_type *section, *section_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;

  struct cfg_schema_section *schema_section;
  struct cfg_schema_section *schema_section_first, *schema_section_last;
  struct cfg_schema_entry *schema_entry;
  size_t i;

  bool error = false;
  bool warning = false;
  bool hasName = false;

  if (db->schema == NULL) {
    return -1;
  }

  CFG_FOR_ALL_SECTION_TYPES(db, section, section_it) {
    /* check for missing schema sections */
    schema_section_first = avl_find_element(&db->schema->sections, section->type, schema_section_first, _section_node);

    if (schema_section_first == NULL) {
      if (ignore_unknown) {
        continue;
      }

      cfg_append_printable_line(out, "Cannot find schema for section type '%s'", section->type);

      if (cleanup) {
        cfg_db_remove_sectiontype(db, section->type);
      }

      error |= true;
      continue;
    }

    schema_section_last = avl_find_le_element(&db->schema->sections, section->type, schema_section_last, _section_node);

    /* iterate over all schema for a certain section type */
    avl_for_element_range(schema_section_first, schema_section_last, schema_section, _section_node) {
      /* check data of named sections in db */
      CFG_FOR_ALL_SECTION_NAMES(section, named, named_it) {
        warning = false;
        hasName = cfg_db_is_named_section(named);

        if (hasName) {
          if (schema_section->mode == CFG_SSMODE_UNNAMED) {
            cfg_append_printable_line(out,
              "The section type '%s'"
              " has to be used without a name"
              " ('%s' was given as a name)",
              section->type, named->name);

            warning = true;
          }
        }

        if (hasName && !cfg_is_allowed_section_name(named->name)) {
          cfg_append_printable_line(out,
            "The section name '%s' for"
            " type '%s' contains illegal characters",
            named->name, section->type);
          warning = true;
        }

        /* test abort condition */
        if (warning && cleanup) {
          /* remove bad named section */
          cfg_db_remove_namedsection(db, section->type, named->name);
        }

        error |= warning;

        if (warning) {
          continue;
        }

        /* initialize section_name field for validate */
        snprintf(section_name, sizeof(section_name), "'%s%s%s'", section->type, hasName ? "=" : "",
          hasName ? named->name : "");

        /* check for bad values */
        CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
          warning = _validate_cfg_entry(db, section, named, entry, section_name, cleanup, ignore_unknown, out);
          error |= warning;
        }

        /* check custom section validation if everything was fine */
        if (!error && schema_section->cb_validate != NULL) {
          if (schema_section->cb_validate(section_name, named, out)) {
            error = true;
          }
        }
      }
    }
    if (cleanup && avl_is_empty(&section->names)) {
      /* if section type is empty, remove it too */
      cfg_db_remove_sectiontype(db, section->type);
    }
  }

  avl_for_each_element(&db->schema->sections, schema_section, _section_node) {
    section = cfg_db_find_sectiontype(db, schema_section->type);
    if (schema_section->mode == CFG_SSMODE_NAMED_MANDATORY) {
      /* search for missing mandatory sections */
      if (section == NULL || avl_is_empty(&section->names)) {
        warning = true;
      }
      else {
        named = avl_first_element(&section->names, named, node);
        warning = !cfg_db_is_named_section(named) && section->names.count < 2;
      }
      if (warning) {
        cfg_append_printable_line(out, "Missing mandatory section of type '%s'", schema_section->type);
      }
      error |= warning;
    }

    /* check for missing values */
    for (i = 0; i < schema_section->entry_count; i++) {
      schema_entry = &schema_section->entries[i];
      if (section && strarray_is_empty_c(&schema_entry->def)) {
        /* found a mandatory schema entry */

        warning = true;
        named = cfg_db_get_unnamed_section(section);
        if (named) {
          /* entry not in unnamed section */
          warning = cfg_db_get_entry(named, schema_entry->key.entry) == NULL;
        }
        if (warning) {
          /* no mandatory value in unnamed section, check named sections */
          warning = false;

          avl_for_each_element(&section->names, named, node) {
            if (named->name != NULL && cfg_db_get_entry(named, schema_entry->key.entry) == NULL) {
              /* found a named section without mandatory entry */
              warning = true;
              cfg_append_printable_line(
                out, "Missing mandatory entry of type '%s', name '%s' and key '%s'",
                schema_section->type, named->name, schema_entry->key.entry);
              break;
            }
          }
        }
        error |= warning;
      }
    }
  }
  return error ? -1 : 0;
}